

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.cpp
# Opt level: O0

double __thiscall PointLight::getShadowRatio(PointLight *this,Scene *scene,Vector3 *p)

{
  bool bVar1;
  reference ppOVar2;
  undefined1 local_d8 [8];
  Collision coll;
  __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_50;
  const_iterator o;
  double dist;
  Vector3 dir;
  Vector3 *p_local;
  Scene *scene_local;
  PointLight *this_local;
  
  dir.z = (double)p;
  operator-((Vector3 *)&dist,&this->m_o,p);
  o._M_current = (Object **)Vector3::mod((Vector3 *)&dist);
  local_50._M_current = (Object **)Scene::objectsBegin(scene);
  while( true ) {
    coll.is_internal = (double)Scene::objectsEnd(scene);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)&coll.is_internal);
    if (!bVar1) {
      return 1.0;
    }
    ppOVar2 = __gnu_cxx::
              __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
              ::operator*(&local_50);
    (*(*ppOVar2)->_vptr_Object[2])(local_d8,*ppOVar2,dir.z,&dist);
    bVar1 = Collision::isHit((Collision *)local_d8);
    if ((bVar1) && (coll.n.z + 1e-06 < (double)o._M_current)) break;
    __gnu_cxx::__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
    ::operator++(&local_50,0);
  }
  return 0.0;
}

Assistant:

double PointLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    Vector3 dir = m_o - p;
    double dist = dir.mod();
    for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
    {
        Collision coll = (*o)->collide(p, dir);
        if (coll.isHit() && coll.dist + Const::EPS < dist) return 0;
    }
    return 1;
}